

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_decimal128(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *__s1;
  size_t len;
  bson_decimal128_t decimal128;
  
  decimal128.high = 0x3040000000000000;
  decimal128.low = 0xb;
  uVar3 = bson_new();
  cVar1 = bson_append_decimal128(uVar3,"decimal128",0xffffffffffffffff,&decimal128);
  if (cVar1 == '\0') {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x1b9,"test_bson_as_json_decimal128",
            "bson_append_decimal128 (b, \"decimal128\", -1, &decimal128)");
    abort();
  }
  __s1 = (char *)bson_as_json(uVar3,&len);
  if (__s1 != "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
    iVar2 = strcmp(__s1,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",__s1,
              "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
      abort();
    }
  }
  bson_free(__s1);
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_bson_as_json_decimal128 (void)
{
   size_t len;
   bson_t *b;
   char *str;
   bson_decimal128_t decimal128;
   decimal128.high = 0x3040000000000000ULL;
   decimal128.low = 0x000000000000000B;

   b = bson_new ();
   BSON_ASSERT (bson_append_decimal128 (b, "decimal128", -1, &decimal128));
   str = bson_as_json (b, &len);
   ASSERT_CMPSTR (str,
                  "{ "
                  "\"decimal128\" : { \"$numberDecimal\" : \"11\" }"
                  " }");

   bson_free (str);
   bson_destroy (b);
}